

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O2

TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> * __thiscall
ASDCP::MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>::OpenMXFRead
          (TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> *this,
          string *filename)

{
  ILogSink *pIVar1;
  char *fmt;
  undefined1 local_e0 [208];
  
  filename[0x29]._M_string_length = 0;
  (**(code **)(**(long **)&filename->field_2 + 0x10))();
  if (*(int *)&this->_vptr_TrackFileReader < 0) {
LAB_001bf7f0:
    pIVar1 = (ILogSink *)Kumu::DefaultLogSink();
    fmt = "TrackFileReader::OpenMXFRead, SeekToRIP failed\n";
  }
  else {
    SeekToRIP((MXF *)local_e0,(IFileReader *)(filename->field_2)._M_allocated_capacity);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_e0);
    Kumu::Result_t::~Result_t((Result_t *)local_e0);
    if (*(int *)&this->_vptr_TrackFileReader < 0) goto LAB_001bf7f0;
    RIP::InitFromFile((RIP *)local_e0,(IFileReader *)(filename[0x1d].field_2._M_local_buf + 8));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_e0);
    Kumu::Result_t::~Result_t((Result_t *)local_e0);
    if (*(int *)&this->_vptr_TrackFileReader < 0) {
      pIVar1 = (ILogSink *)Kumu::DefaultLogSink();
      fmt = "File contains no RIP\n";
    }
    else {
      if (*(undefined1 **)((long)&filename[0x21].field_2 + 8) !=
          (undefined1 *)((long)&filename[0x21].field_2 + 8)) goto LAB_001bf806;
      pIVar1 = (ILogSink *)Kumu::DefaultLogSink();
      fmt = "RIP contains no Pairs.\n";
    }
  }
  Kumu::ILogSink::Error(pIVar1,fmt);
LAB_001bf806:
  (**(code **)(**(long **)&filename->field_2 + 0x28))
            (local_e0 + 0x68,*(long **)&filename->field_2,0,0);
  Kumu::Result_t::~Result_t((Result_t *)(local_e0 + 0x68));
  OP1aHeader::InitFromFile
            ((OP1aHeader *)local_e0,(IFileReader *)((filename->field_2)._M_local_buf + 8));
  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_e0);
  Kumu::Result_t::~Result_t((Result_t *)local_e0);
  if (*(int *)&this->_vptr_TrackFileReader < 0) {
    pIVar1 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar1,"TrackFileReader::OpenMXFRead, header init failed\n");
  }
  return this;
}

Assistant:

Result_t OpenMXFRead(const std::string& filename)
	{
	  m_LastPosition = 0;
	  Result_t result = m_File->OpenRead(filename);

	  if ( ASDCP_SUCCESS(result) )
        result = SeekToRIP(*m_File);

	  if ( ASDCP_SUCCESS(result) )
	    {
          result = m_RIP.InitFromFile(*m_File);

	      if ( ASDCP_FAILURE(result) )
		{
		  DefaultLogSink().Error("File contains no RIP\n");
		}
	      else if ( m_RIP.PairArray.empty() )
		{
		  DefaultLogSink().Error("RIP contains no Pairs.\n");
		}
	    }
	  else
	    {
	      DefaultLogSink().Error("TrackFileReader::OpenMXFRead, SeekToRIP failed\n");
	    }

      m_File->Seek(0);
      result = m_HeaderPart.InitFromFile(*m_File);

	  if ( KM_FAILURE(result) )
	    {
	      DefaultLogSink().Error("TrackFileReader::OpenMXFRead, header init failed\n");
	    }

	  return result;
	}